

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool wallet::GetAvoidReuseFlag(CWallet *wallet,UniValue *param)

{
  bool bVar1;
  bool bVar2;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CWallet::IsWalletFlagSet(wallet,1);
  bVar2 = bVar1;
  if (param->typ != VNULL) {
    bVar2 = UniValue::get_bool(param);
  }
  if (bVar1 || bVar2 != true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return bVar2;
    }
  }
  else {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"wallet does not have the \"avoid reuse\" feature enabled","");
    JSONRPCError(__return_storage_ptr__,-4,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool GetAvoidReuseFlag(const CWallet& wallet, const UniValue& param) {
    bool can_avoid_reuse = wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);
    bool avoid_reuse = param.isNull() ? can_avoid_reuse : param.get_bool();

    if (avoid_reuse && !can_avoid_reuse) {
        throw JSONRPCError(RPC_WALLET_ERROR, "wallet does not have the \"avoid reuse\" feature enabled");
    }

    return avoid_reuse;
}